

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O0

void __thiscall
visitor_test_should_parse_utc_time_with_microseconds_Test::
~visitor_test_should_parse_utc_time_with_microseconds_Test
          (visitor_test_should_parse_utc_time_with_microseconds_Test *this)

{
  visitor_test_should_parse_utc_time_with_microseconds_Test *this_local;
  
  ~visitor_test_should_parse_utc_time_with_microseconds_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(visitor_test, should_parse_utc_time_with_microseconds)
{
    const char* str = "14:09:30.125456";
    auto time = Fixpp::details::LexicalCast<Fixpp::Type::UTCTimeOnly>::cast(str, std::strlen(str));

    auto t = time.time();
    std::tm tm{};
    gmtime_r(&t, &tm);

    ASSERT_EQ(tm.tm_hour, 14);
    ASSERT_EQ(tm.tm_min, 9);
    ASSERT_EQ(tm.tm_sec, 30);

    ASSERT_EQ(time.msec().value(), 125);
    ASSERT_EQ(time.usec().value(), 456);
}